

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_clear(secp256k1_gej *r)

{
  r->infinity = 0;
  secp256k1_fe_impl_clear(&r->x);
  secp256k1_fe_impl_clear(&r->y);
  secp256k1_fe_impl_clear(&r->z);
  return;
}

Assistant:

static void secp256k1_gej_clear(secp256k1_gej *r) {
    r->infinity = 0;
    secp256k1_fe_clear(&r->x);
    secp256k1_fe_clear(&r->y);
    secp256k1_fe_clear(&r->z);

    SECP256K1_GEJ_VERIFY(r);
}